

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O2

bool test_encode_uint_custom_size(char *buf,uint64_t val,int size)

{
  uint uVar1;
  
  switch(size) {
  case 1:
    if (0x7f < val) {
      return false;
    }
    *buf = (char)val;
    break;
  case 2:
    if (0xff < val) {
      return false;
    }
    *buf = -0x34;
    buf[1] = (char)val;
    break;
  case 3:
    if (0xffff < val) {
      return false;
    }
    *buf = -0x33;
    *(ushort *)(buf + 1) = (ushort)val << 8 | (ushort)val >> 8;
    break;
  default:
    abort();
  case 5:
    if (val >> 0x20 != 0) {
      return false;
    }
    *buf = -0x32;
    uVar1 = (uint)val;
    *(uint *)(buf + 1) =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    break;
  case 9:
    *buf = -0x31;
    *(uint64_t *)(buf + 1) =
         val >> 0x38 | (val & 0xff000000000000) >> 0x28 | (val & 0xff0000000000) >> 0x18 |
         (val & 0xff00000000) >> 8 | (val & 0xff000000) << 8 | (val & 0xff0000) << 0x18 |
         (val & 0xff00) << 0x28 | val << 0x38;
  }
  return true;
}

Assistant:

static NOINLINE bool
test_encode_uint_custom_size(char *buf, uint64_t val, int size)
{
	char *pos;
	switch (size) {
	case 1:
		if (val > 0x7f)
			return false;
		mp_store_u8(buf, val);
		return true;
	case 2:
		if (val > UINT8_MAX)
			return false;
		pos = mp_store_u8(buf, 0xcc);
		mp_store_u8(pos, (uint8_t)val);
		return true;
	case 3:
		if (val > UINT16_MAX)
			return false;
		pos = mp_store_u8(buf, 0xcd);
		mp_store_u16(pos, (uint16_t)val);
		return true;
	case 5:
		if (val > UINT32_MAX)
			return false;
		pos = mp_store_u8(buf, 0xce);
		mp_store_u32(pos, (uint32_t)val);
		return true;
	case 9:
		pos = mp_store_u8(buf, 0xcf);
		mp_store_u64(pos, val);
		return true;
	}
	abort();
	return false;
}